

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-constant.h
# Opt level: O1

void __thiscall
wasm::PossibleConstantValues::note(PossibleConstantValues *this,Expression *expr,Module *wasm)

{
  Id IVar1;
  ulong uVar2;
  variant<wasm::PossibleConstantValues::None,wasm::Literal,wasm::Name,wasm::PossibleConstantValues::Many>
  *this_00;
  bool bVar3;
  Global *pGVar4;
  ulong uVar5;
  byte unaff_R13B;
  Literal local_60;
  variant<wasm::PossibleConstantValues::None,wasm::Literal,wasm::Name,wasm::PossibleConstantValues::Many>
  *local_48;
  Module *local_40;
  Many local_31;
  
  bVar3 = Properties::isSingleConstantExpression(expr);
  if (!bVar3) {
    IVar1 = expr->_id;
    local_48 = (variant<wasm::PossibleConstantValues::None,wasm::Literal,wasm::Name,wasm::PossibleConstantValues::Many>
                *)this;
    local_40 = wasm;
    if (IVar1 == TupleMakeId) {
      uVar2 = expr[1].type.id;
      unaff_R13B = uVar2 == 0;
      if (!(bool)unaff_R13B) {
        uVar5 = 0;
        do {
          if (expr[1].type.id <= uVar5) {
            __assert_fail("index < usedElements",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                          ,0xbc,
                          "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                         );
          }
          bVar3 = Properties::isSingleConstantExpression
                            (*(Expression **)(*(long *)(expr + 1) + uVar5 * 8));
          if (!bVar3) break;
          uVar5 = uVar5 + 1;
          unaff_R13B = uVar2 == uVar5;
        } while (!(bool)unaff_R13B);
      }
    }
    this_00 = local_48;
    this = (PossibleConstantValues *)local_48;
    if ((~unaff_R13B & 1) != 0 || IVar1 != TupleMakeId) {
      if ((expr->_id == GlobalGetId) &&
         (pGVar4 = Module::getGlobal(local_40,(Name)expr[1]), pGVar4->mutable_ == false)) {
        note<wasm::Name>((PossibleConstantValues *)this_00,(Name)expr[1]);
        return;
      }
      std::
      variant<wasm::PossibleConstantValues::None,wasm::Literal,wasm::Name,wasm::PossibleConstantValues::Many>
      ::operator=(this_00,&local_31);
      return;
    }
  }
  Properties::getLiteral(&local_60,expr);
  note<wasm::Literal>(this,&local_60);
  Literal::~Literal(&local_60);
  return;
}

Assistant:

void note(Expression* expr, Module& wasm) {
    // If this is a constant literal value, note that.
    if (Properties::isConstantExpression(expr)) {
      note(Properties::getLiteral(expr));
      return;
    }

    // If this is an immutable global that we get, note that.
    if (auto* get = expr->dynCast<GlobalGet>()) {
      auto* global = wasm.getGlobal(get->name);
      if (global->mutable_ == Immutable) {
        note(get->name);
        return;
      }
    }

    // Otherwise, this is not something we can reason about.
    noteUnknown();
  }